

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::NegativeTest::testMaxClipDistancesBuildingErrors
          (NegativeTest *this,Functions *gl)

{
  GLchar *pGVar1;
  LinkageStatus *pLVar2;
  TestLog *this_00;
  MessageBuilder *this_01;
  bool bVar3;
  MessageBuilder local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  Program program;
  Functions *gl_local;
  NegativeTest *this_local;
  
  pGVar1 = m_vertex_shader_code_case_1;
  program.m_gl = gl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pGVar1,&local_c1);
  pGVar1 = m_fragment_shader_code;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pGVar1,&local_f9);
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118);
  Utility::Program::Program((Program *)local_a0,gl,&local_c0,&local_f8,&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pLVar2 = Utility::Program::ProgramStatus((Program *)local_a0);
  bVar3 = pLVar2->program_id == 0;
  if (!bVar3) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_298,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_298,
                         (char (*) [164])
                         "Functional test have failed. Building shader with explicit redeclaration of gl_ClipDistance[] array with size (gl_MaxClipDistances + 1) has unexpectedly succeeded."
                        );
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_298);
  }
  Utility::Program::~Program((Program *)local_a0);
  return bVar3;
}

Assistant:

bool gl3cts::ClipDistance::NegativeTest::testMaxClipDistancesBuildingErrors(const glw::Functions& gl)
{
	/* Check that building shader program fails when gl_ClipDistance is
	 redeclared in the shader with size higher than GL_MAX_CLIP_DISTANCES. */

	gl3cts::ClipDistance::Utility::Program program(gl, m_vertex_shader_code_case_1, m_fragment_shader_code);

	if (program.ProgramStatus().program_id)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Functional test have failed. "
							  "Building shader with explicit redeclaration of gl_ClipDistance[] array with size "
							  "(gl_MaxClipDistances + 1) has unexpectedly succeeded."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}